

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void check_config(vector_t *cfg)

{
  pointer ptVar1;
  pointer ptVar2;
  pointer piVar3;
  code *pcVar4;
  char extraout_AL;
  bool bVar5;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  char extraout_AL_13;
  char extraout_AL_14;
  char extraout_AL_15;
  char extraout_AL_16;
  ulong uVar6;
  undefined8 uVar7;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  double __x_15;
  double __x_16;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_d0;
  bool local_cc [4];
  Result local_c8;
  ResultBuilder local_a8;
  Expression_lhs<const_QString_&> local_30;
  
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a8,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x51,"cfg.vector().size() == 1","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  local_30.lhs = (QString *)
                 (((long)(cfg->m_vector).
                         super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(cfg->m_vector).
                         super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
                         super__Vector_impl_data._M_start >> 5) * 0x6db6db6db6db6db7);
  local_30.m_at = local_d0.m_at;
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  doctest::detail::Expression_lhs<unsigned_long_const>::operator==
            (&local_c8,(Expression_lhs<unsigned_long_const> *)&local_30,(int *)local_cc);
  doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
  local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
  doctest::String::~String(&local_c8.m_decomp);
  doctest::detail::ResultBuilder::log(&local_a8,__x);
  if (extraout_AL != '\0') {
    pcVar4 = (code *)swi(3);
    (*pcVar4)();
    return;
  }
  if (local_a8.super_AssertData.m_failed == true) {
    bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
    if (bVar5) goto LAB_00110815;
  }
  doctest::String::~String(&local_a8.super_AssertData.m_decomp);
  doctest::String::~String(&local_a8.super_AssertData.m_exception);
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a8,DT_REQUIRE,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
             ,0x52,"cfg.vector().at( 0 ).string_field() == \"one\"","","");
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
  ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
      super__Vector_impl_data._M_finish == ptVar1) {
LAB_001106f2:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110704:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110716:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110728:
    uVar7 = 0;
    uVar6 = 0;
LAB_00110733:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,
               uVar6);
LAB_00110741:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110753:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110765:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110777:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110789:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0011079b:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001107ad:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001107bf:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001107d1:
    uVar7 = 0;
    uVar6 = 0;
LAB_001107dc:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,
               uVar6);
LAB_001107ea:
    uVar7 = 0;
    uVar6 = 0;
LAB_001107f5:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,
               uVar6);
  }
  else {
    local_30.m_at = local_d0.m_at;
    local_30.lhs = &ptVar1->m_string_field;
    doctest::detail::Expression_lhs<const_QString_&>::operator==<char[4],_nullptr>
              (&local_c8,&local_30,(char (*) [4])"one");
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_00);
    if (extraout_AL_00 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x53,"cfg.vector().at( 0 ).no_value_field() == true","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_00110704;
    local_30.lhs = (QString *)((ulong)local_d0.m_at << 0x20 | (ulong)ptVar1->m_no_value_field);
    local_cc[0] = true;
    doctest::detail::Expression_lhs<bool_const>::operator==
              (&local_c8,(Expression_lhs<bool_const> *)&local_30,local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_01);
    if (extraout_AL_01 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x54,"cfg.vector().at( 0 ).int_field().size() == 2","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_00110716;
    local_30.lhs = (QString *)
                   ((long)(ptVar1->m_int_field).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(ptVar1->m_int_field).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2);
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_c8,(Expression_lhs<unsigned_long_const> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_02);
    if (extraout_AL_02 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x55,"cfg.vector().at( 0 ).int_field().at( 0 ) == 100","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
         super__Vector_impl_data._M_finish == ptVar1) ||
       (ptVar2 = (pointer)(ptVar1->m_int_field).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
       (pointer)(ptVar1->m_int_field).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish == ptVar2)) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001106e0:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      goto LAB_001106f2;
    }
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    local_30.lhs = (QString *)ptVar2;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_03);
    if (extraout_AL_03 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x56,"cfg.vector().at( 0 ).int_field().at( 1 ) == 200","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_00110728;
    piVar3 = (ptVar1->m_int_field).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(ptVar1->m_int_field).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
    if (uVar6 < 2) {
      uVar7 = 1;
      goto LAB_00110733;
    }
    local_30.lhs = (QString *)(piVar3 + 1);
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_04);
    if (extraout_AL_04 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x57,"cfg.vector().at( 0 ).custom_field().m_value == 300","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_00110741;
    local_30.lhs = (QString *)&ptVar1->m_custom_field;
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = true;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_05);
    if (extraout_AL_05 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x59,"cfg.vector().at( 0 ).bool_scalar().bool_scalar() == true","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_00110753;
    local_30.lhs = (QString *)&ptVar1->m_bool_scalar;
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    doctest::detail::Expression_lhs<bool_const&>::operator==
              (&local_c8,(Expression_lhs<bool_const&> *)&local_30,local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_06);
    if (extraout_AL_06 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x5a,"cfg.vector().at( 0 ).bool_scalar().string_field() == \"one\"","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_00110765;
    local_30.lhs = &(ptVar1->m_bool_scalar).m_string_field;
    local_30.m_at = local_d0.m_at;
    doctest::detail::Expression_lhs<const_QString_&>::operator==<char[4],_nullptr>
              (&local_c8,&local_30,(char (*) [4])"one");
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_07);
    if (extraout_AL_07 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x5c,"cfg.vector().at( 0 ).int_scalar().int_scalar() == 100","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_00110777;
    local_30.lhs = (QString *)&ptVar1->m_int_scalar;
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_08);
    if (extraout_AL_08 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x5d,"cfg.vector().at( 0 ).int_scalar().string_field() == \"one\\n\\\"\\r\\t\\\\\"",
               "","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_00110789;
    local_30.lhs = &(ptVar1->m_int_scalar).m_string_field;
    local_30.m_at = local_d0.m_at;
    doctest::detail::Expression_lhs<const_QString_&>::operator==<char[9],_nullptr>
              (&local_c8,&local_30,(char (*) [9])"one\n\"\r\t\\");
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_09);
    if (extraout_AL_09 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x5f,"cfg.vector().at( 0 ).string_scalar().string_scalar() == \"string\"","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_0011079b;
    local_30.lhs = &(ptVar1->m_string_scalar).m_string_scalar;
    local_30.m_at = local_d0.m_at;
    doctest::detail::Expression_lhs<const_QString_&>::operator==<char[7],_nullptr>
              (&local_c8,&local_30,(char (*) [7])"string");
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_10);
    if (extraout_AL_10 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x60,"cfg.vector().at( 0 ).string_scalar().string_field().isEmpty()","","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_001107ad;
    local_30.lhs = (QString *)
                   ((ulong)((ptVar1->m_string_scalar).m_string_field.d.size == 0) |
                   (ulong)local_d0.m_at << 0x20);
    doctest::detail::Expression_lhs::operator_cast_to_Result(&local_c8,(Expression_lhs *)&local_30);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_11);
    if (extraout_AL_11 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x62,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().size() == 3","",
               "");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_001107bf;
    local_30.lhs = (QString *)
                   ((long)(ptVar1->m_int_scalar_vector).m_int_scalar_vector.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(ptVar1->m_int_scalar_vector).m_int_scalar_vector.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2);
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_c8,(Expression_lhs<unsigned_long_const> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_12);
    if (extraout_AL_12 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,99,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 0 ) == 100","",
               "");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
         super__Vector_impl_data._M_finish == ptVar1) ||
       (ptVar2 = (pointer)(ptVar1->m_int_scalar_vector).m_int_scalar_vector.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
       (pointer)(ptVar1->m_int_scalar_vector).m_int_scalar_vector.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish == ptVar2)) goto LAB_001106e0;
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    local_30.lhs = (QString *)ptVar2;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_13);
    if (extraout_AL_13 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,100,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 1 ) == 200",""
               ,"");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_001107d1;
    piVar3 = (ptVar1->m_int_scalar_vector).m_int_scalar_vector.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(ptVar1->m_int_scalar_vector).m_int_scalar_vector.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish - (long)piVar3 >> 2;
    if (uVar6 < 2) {
      uVar7 = 1;
      goto LAB_001107dc;
    }
    local_30.lhs = (QString *)(piVar3 + 1);
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = false;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_14);
    if (extraout_AL_14 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x65,"cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 2 ) == 300",
               "","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish == ptVar1) goto LAB_001107ea;
    piVar3 = (ptVar1->m_int_scalar_vector).m_int_scalar_vector.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(ptVar1->m_int_scalar_vector).m_int_scalar_vector.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish - (long)piVar3 >> 2;
    if (uVar6 < 3) {
      uVar7 = 2;
      goto LAB_001107f5;
    }
    local_30.lhs = (QString *)(piVar3 + 2);
    local_30.m_at = local_d0.m_at;
    local_cc[0] = true;
    local_cc[1] = true;
    local_cc[2] = false;
    local_cc[3] = false;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_c8,(Expression_lhs<int_const&> *)&local_30,(int *)local_cc);
    doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
    local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
    doctest::String::~String(&local_c8.m_decomp);
    doctest::detail::ResultBuilder::log(&local_a8,__x_15);
    if (extraout_AL_15 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    if (local_a8.super_AssertData.m_failed == true) {
      bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
      if (bVar5) {
        doctest::detail::throwException();
      }
    }
    doctest::String::~String(&local_a8.super_AssertData.m_decomp);
    doctest::String::~String(&local_a8.super_AssertData.m_exception);
    doctest::detail::ResultBuilder::ResultBuilder
              (&local_a8,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/igormironchik[P]cfgfile/tests/auto/QtGenerator/main.cpp"
               ,0x69,
               "cfg.vector().at( 0 ).int_scalar_vector().string_field() == \"StringStringStringStringStringStringStringString\" \"StringStringStringStringStringStringStringString\" \"StringStringStringString\""
               ,"","");
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d0,DT_REQUIRE);
    ptVar1 = (cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((cfg->m_vector).super__Vector_base<cfg::tags_t,_std::allocator<cfg::tags_t>_>._M_impl.
        super__Vector_impl_data._M_finish != ptVar1) {
      local_30.lhs = &(ptVar1->m_int_scalar_vector).m_string_field;
      local_30.m_at = local_d0.m_at;
      doctest::detail::Expression_lhs<const_QString_&>::operator==<char[121],_nullptr>
                (&local_c8,&local_30,
                 (char (*) [121])
                 "StringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringStringString"
                );
      doctest::String::operator=(&local_a8.super_AssertData.m_decomp,&local_c8.m_decomp);
      local_a8.super_AssertData.m_failed = (bool)(local_c8.m_passed ^ 1);
      doctest::String::~String(&local_c8.m_decomp);
      doctest::detail::ResultBuilder::log(&local_a8,__x_16);
      if (extraout_AL_16 != '\0') {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      if (local_a8.super_AssertData.m_failed == true) {
        bVar5 = doctest::detail::checkIfShouldThrow(local_a8.super_AssertData.m_at);
        if (bVar5) {
          doctest::detail::throwException();
        }
      }
      doctest::String::~String(&local_a8.super_AssertData.m_decomp);
      doctest::String::~String(&local_a8.super_AssertData.m_exception);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00110815:
  doctest::detail::throwException();
}

Assistant:

void check_config( const cfg::vector_t & cfg )
{
	REQUIRE( cfg.vector().size() == 1 );
	REQUIRE( cfg.vector().at( 0 ).string_field() == "one" );
	REQUIRE( cfg.vector().at( 0 ).no_value_field() == true );
	REQUIRE( cfg.vector().at( 0 ).int_field().size() == 2 );
	REQUIRE( cfg.vector().at( 0 ).int_field().at( 0 ) == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_field().at( 1 ) == 200 );
	REQUIRE( cfg.vector().at( 0 ).custom_field().m_value == 300 );

	REQUIRE( cfg.vector().at( 0 ).bool_scalar().bool_scalar() == true );
	REQUIRE( cfg.vector().at( 0 ).bool_scalar().string_field() == "one" );

	REQUIRE( cfg.vector().at( 0 ).int_scalar().int_scalar() == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar().string_field() == "one\n\"\r\t\\" );

	REQUIRE( cfg.vector().at( 0 ).string_scalar().string_scalar() == "string" );
	REQUIRE( cfg.vector().at( 0 ).string_scalar().string_field().isEmpty() );

	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().size() == 3 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 0 ) == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 1 ) == 200 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 2 ) == 300 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().string_field() ==
		"StringStringStringStringStringStringStringString"
		"StringStringStringStringStringStringStringString"
		"StringStringStringString" );
}